

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void qclab::print<float>(complex<float> val)

{
  complex<float> *pcVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Da_00;
  char local_1a;
  char sign;
  float imag;
  float real;
  complex<float> val_local;
  
  fVar2 = std::real<float>((complex<float> *)&imag);
  pcVar1 = (complex<float> *)&imag;
  std::imag<float>(pcVar1);
  std::abs((int)pcVar1);
  fVar3 = std::imag<float>((complex<float> *)&imag);
  local_1a = '+';
  if (fVar3 < 0.0) {
    local_1a = '-';
  }
  pcVar1 = (complex<float> *)&imag;
  fVar3 = std::abs<float>(pcVar1);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    std::abs((int)pcVar1);
    if ((extraout_XMM0_Da_00 != 0.0) || (NAN(extraout_XMM0_Da_00))) {
      if ((extraout_XMM0_Da != 0.0) || (NAN(extraout_XMM0_Da))) {
        printf("%10.4f %c %6.4fi",(double)fVar2,(double)extraout_XMM0_Da,(ulong)(uint)(int)local_1a)
        ;
      }
      else {
        printf("%10.4f %c      0i",(double)fVar2,(ulong)(uint)(int)local_1a);
      }
    }
    else {
      printf("         0 %c %6.4fi",(double)extraout_XMM0_Da,(ulong)(uint)(int)local_1a);
    }
  }
  else {
    printf("                   0");
  }
  return;
}

Assistant:

void print( const std::complex< T > val ) {
    const T real = std::real( val ) ;
    const T imag = std::abs( std::imag( val ) ) ;
    const char sign = std::imag( val ) >= T(0) ? '+' : '-' ;
    if ( std::abs( val ) == T(0) ) {
      std::printf( "                   0" ) ;
    } else if ( std::abs( real ) == T(0) ) {
      std::printf( "         0 %c %6.4fi" , sign , imag ) ;
    } else if ( imag == T(0) ) {
      std::printf( "%10.4f %c      0i" , real , sign ) ;
    } else {
      std::printf( "%10.4f %c %6.4fi" , real , sign , imag ) ;
    }
  }